

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O2

void duckdb::udf_max_constant<int>(DataChunk *args,ExpressionState *state,Vector *result)

{
  reference pvVar1;
  int iVar2;
  idx_t col_idx;
  ulong __n;
  
  duckdb::Vector::SetVectorType((VectorType)result);
  iVar2 = 0;
  for (__n = 0; __n < (ulong)((*(long *)(args + 8) - *(long *)args) / 0x68); __n = __n + 1) {
    pvVar1 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,__n);
    if (((*(byte **)(pvVar1 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar1 + 0x28) & 1) != 0)) &&
       (iVar2 <= **(int **)(pvVar1 + 0x20))) {
      iVar2 = **(int **)(pvVar1 + 0x20);
    }
  }
  **(int **)(result + 0x20) = iVar2;
  return;
}

Assistant:

static void udf_max_constant(DataChunk &args, ExpressionState &state, Vector &result) {
	TYPE max = 0;
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	for (idx_t col_idx = 0; col_idx < args.ColumnCount(); col_idx++) {
		auto &input = args.data[col_idx];
		if (ConstantVector::IsNull(input)) {
			// constant null, skip
			continue;
		}
		auto input_data = ConstantVector::GetData<TYPE>(input);
		if (max < input_data[0]) {
			max = input_data[0];
		}
	}
	auto result_data = ConstantVector::GetData<TYPE>(result);
	result_data[0] = max;
}